

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O2

void get_4d_sad_from_mm256_epi32(__m256i *v,uint32_t *res)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  
  auVar4 = vpshufd_avx2((undefined1  [32])*v,0xf5);
  auVar2 = vphaddd_avx2((undefined1  [32])v[1],(undefined1  [32])v[1]);
  auVar5 = vpshufd_avx2((undefined1  [32])v[2],0xf5);
  auVar3 = vphaddd_avx2((undefined1  [32])v[3],(undefined1  [32])v[3]);
  auVar4 = vpaddd_avx2(auVar4,(undefined1  [32])*v);
  auVar5 = vpaddd_avx2((undefined1  [32])v[2],auVar5);
  auVar2 = vpshufd_avx2(auVar2,0xe0);
  auVar2 = vpblendd_avx2(auVar4,auVar2,0xaa);
  auVar4 = vpshufd_avx2(auVar3,0xe0);
  auVar4 = vpblendd_avx2(auVar5,auVar4,0xaa);
  auVar5 = vpunpcklqdq_avx2(auVar2,auVar4);
  auVar4 = vpunpckhqdq_avx2(auVar2,auVar4);
  auVar4 = vpaddd_avx2(auVar5,auVar4);
  auVar1 = vpaddd_avx(auVar4._16_16_,auVar4._0_16_);
  *(undefined1 (*) [16])res = auVar1;
  return;
}

Assistant:

static inline void get_4d_sad_from_mm256_epi32(const __m256i *v,
                                               uint32_t *res) {
  __m256i u0, u1, u2, u3;
  const __m256i mask = _mm256_set1_epi64x(~0u);
  __m128i sad;

  // 8 32-bit summation
  u0 = _mm256_srli_si256(v[0], 4);
  u1 = _mm256_srli_si256(v[1], 4);
  u2 = _mm256_srli_si256(v[2], 4);
  u3 = _mm256_srli_si256(v[3], 4);

  u0 = _mm256_add_epi32(u0, v[0]);
  u1 = _mm256_add_epi32(u1, v[1]);
  u2 = _mm256_add_epi32(u2, v[2]);
  u3 = _mm256_add_epi32(u3, v[3]);

  u0 = _mm256_and_si256(u0, mask);
  u1 = _mm256_and_si256(u1, mask);
  u2 = _mm256_and_si256(u2, mask);
  u3 = _mm256_and_si256(u3, mask);
  // 4 32-bit summation, evenly positioned

  u1 = _mm256_slli_si256(u1, 4);
  u3 = _mm256_slli_si256(u3, 4);

  u0 = _mm256_or_si256(u0, u1);
  u2 = _mm256_or_si256(u2, u3);
  // 8 32-bit summation, interleaved

  u1 = _mm256_unpacklo_epi64(u0, u2);
  u3 = _mm256_unpackhi_epi64(u0, u2);

  u0 = _mm256_add_epi32(u1, u3);
  sad = _mm_add_epi32(_mm256_extractf128_si256(u0, 1),
                      _mm256_castsi256_si128(u0));
  _mm_storeu_si128((__m128i *)res, sad);
}